

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3PcacheSetPageSize(PCache *pCache,int szPage)

{
  _func_void_sqlite3_pcache_ptr_int *p_Var1;
  int iVar2;
  sqlite3_pcache *psVar3;
  int iVar4;
  
  iVar4 = 0;
  if (pCache->szPage != 0) {
    psVar3 = (*sqlite3Config.pcache2.xCreate)
                       (szPage,pCache->szExtra + 0x48,(uint)pCache->bPurgeable);
    p_Var1 = sqlite3Config.pcache2.xCachesize;
    if (psVar3 == (sqlite3_pcache *)0x0) {
      iVar4 = 7;
    }
    else {
      iVar2 = numberOfCachePages(pCache);
      (*p_Var1)(psVar3,iVar2);
      if (pCache->pCache != (sqlite3_pcache *)0x0) {
        (*sqlite3Config.pcache2.xDestroy)(pCache->pCache);
      }
      pCache->pCache = psVar3;
      pCache->szPage = szPage;
    }
  }
  return iVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3PcacheSetPageSize(PCache *pCache, int szPage){
  assert( pCache->nRefSum==0 && pCache->pDirty==0 );
  if( pCache->szPage ){
    sqlite3_pcache *pNew;
    pNew = sqlite3GlobalConfig.pcache2.xCreate(
                szPage, pCache->szExtra + ROUND8(sizeof(PgHdr)),
                pCache->bPurgeable
    );
    if( pNew==0 ) return SQLITE_NOMEM_BKPT;
    sqlite3GlobalConfig.pcache2.xCachesize(pNew, numberOfCachePages(pCache));
    if( pCache->pCache ){
      sqlite3GlobalConfig.pcache2.xDestroy(pCache->pCache);
    }
    pCache->pCache = pNew;
    pCache->szPage = szPage;
    pcacheTrace(("%p.PAGESIZE %d\n",pCache,szPage));
  }
  return SQLITE_OK;
}